

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operators.hpp
# Opt level: O0

bool __thiscall
viennamath::op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_>
::equal(op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_>
        *this,op_interface<viennamath::rt_expression_interface<double>_> *other)

{
  op_gradient<double> *poVar1;
  op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_> *local_40;
  op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_> *ptr;
  op_interface<viennamath::rt_expression_interface<double>_> *other_local;
  op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_>
  *this_local;
  
  if (other == (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    local_40 = (op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_>
                *)0x0;
  }
  else {
    local_40 = (op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_>
                *)__dynamic_cast(other,&op_interface<viennamath::rt_expression_interface<double>>::
                                        typeinfo,
                                 &op_unary<viennamath::op_gradient<double>,viennamath::rt_expression_interface<double>>
                                  ::typeinfo,0);
  }
  if (local_40 ==
      (op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_> *)0x0
     ) {
    this_local._7_1_ = false;
  }
  else {
    poVar1 = op(local_40);
    this_local._7_1_ =
         unary_op_equal<viennamath::op_gradient<double>>
                   (poVar1,(op_gradient<double> *)&this->field_0x8);
  }
  return this_local._7_1_;
}

Assistant:

bool equal(const op_interface<InterfaceType> * other) const
      {
        const op_unary<UnaryOperation, InterfaceType> * ptr = dynamic_cast<const op_unary<UnaryOperation, InterfaceType> *>(other);
        if (ptr != NULL)
          return unary_op_equal(ptr->op(), unary_op_); //needed for partial derivatives

        return false;
      }